

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quasiquote_conversion.cpp
# Opt level: O0

bool __thiscall
skiwi::anon_unknown_26::quasiquote_conversion_visitor::has_splicing
          (quasiquote_conversion_visitor *this,cell *in)

{
  bool bVar1;
  reference pvVar2;
  pointer *this_00;
  reference __x;
  cell *v;
  iterator __end5;
  iterator __begin5;
  vector<skiwi::cell,_std::allocator<skiwi::cell>_> *__range5;
  undefined1 local_a0 [8];
  cell c;
  undefined1 local_38 [8];
  vector<skiwi::cell,_std::allocator<skiwi::cell>_> todo;
  cell *in_local;
  quasiquote_conversion_visitor *this_local;
  
  todo.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in;
  std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::vector
            ((vector<skiwi::cell,_std::allocator<skiwi::cell>_> *)local_38);
  std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::push_back
            ((vector<skiwi::cell,_std::allocator<skiwi::cell>_> *)local_38,
             todo.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  do {
    bVar1 = std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::empty
                      ((vector<skiwi::cell,_std::allocator<skiwi::cell>_> *)local_38);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_local._7_1_ = 0;
      break;
    }
    pvVar2 = std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::back
                       ((vector<skiwi::cell,_std::allocator<skiwi::cell>_> *)local_38);
    cell::cell((cell *)local_a0,pvVar2);
    std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::pop_back
              ((vector<skiwi::cell,_std::allocator<skiwi::cell>_> *)local_38);
    bVar1 = tag_is_comma_atsign(this,(cell *)local_a0);
    if (bVar1) {
      this_local._7_1_ = 1;
      bVar1 = true;
    }
    else {
      bVar1 = is_pair(this,(cell *)local_a0);
      if (bVar1) {
        pvVar2 = std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::operator[]
                           ((vector<skiwi::cell,_std::allocator<skiwi::cell>_> *)
                            ((long)&c.value.field_2 + 8),0);
        std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::push_back
                  ((vector<skiwi::cell,_std::allocator<skiwi::cell>_> *)local_38,pvVar2);
        pvVar2 = std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::operator[]
                           ((vector<skiwi::cell,_std::allocator<skiwi::cell>_> *)
                            ((long)&c.value.field_2 + 8),1);
        std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::push_back
                  ((vector<skiwi::cell,_std::allocator<skiwi::cell>_> *)local_38,pvVar2);
      }
      else if (local_a0._0_4_ == ct_vector) {
        this_00 = &c.pair.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        __end5 = std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::begin
                           ((vector<skiwi::cell,_std::allocator<skiwi::cell>_> *)this_00);
        v = (cell *)std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::end
                              ((vector<skiwi::cell,_std::allocator<skiwi::cell>_> *)this_00);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<skiwi::cell_*,_std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>_>
                                           *)&v), bVar1) {
          __x = __gnu_cxx::
                __normal_iterator<skiwi::cell_*,_std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>_>
                ::operator*(&__end5);
          std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::push_back
                    ((vector<skiwi::cell,_std::allocator<skiwi::cell>_> *)local_38,__x);
          __gnu_cxx::
          __normal_iterator<skiwi::cell_*,_std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>_>
          ::operator++(&__end5);
        }
      }
      bVar1 = false;
    }
    cell::~cell((cell *)local_a0);
  } while (!bVar1);
  std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::~vector
            ((vector<skiwi::cell,_std::allocator<skiwi::cell>_> *)local_38);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool has_splicing(const cell& in)
      {
      std::vector<cell> todo;
      todo.push_back(in);
      while (!todo.empty())
        {
        cell c = todo.back();
        todo.pop_back();
        if (tag_is_comma_atsign(c))
          return true;
        if (is_pair(c))
          {
          todo.push_back(c.pair[0]);
          todo.push_back(c.pair[1]);
          }
        else if (c.type == ct_vector)
          {
          for (const auto& v : c.vec)
            todo.push_back(v);
          }
        }
      return false;
      }